

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

void __thiscall IO::Reaction::Reaction(Reaction *this)

{
  _Rb_tree_header *p_Var1;
  
  this->flagReversible_ = true;
  this->flagHasREV_ = false;
  this->flagDuplicate_ = false;
  p_Var1 = &(this->reactants_)._M_t._M_impl.super__Rb_tree_header;
  (this->reactants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->reactants_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->reactants_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->reactants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reactants_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->products_)._M_t._M_impl.super__Rb_tree_header;
  (this->reactants_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->products_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->products_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->products_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->products_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->products_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->products_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->forwardArrhenius_).A = 0.0;
  (this->forwardArrhenius_).n = 0.0;
  (this->forwardArrhenius_).E = 0.0;
  (this->reverseArrhenius_).A = 0.0;
  (this->reverseArrhenius_).n = 0.0;
  *(undefined8 *)((long)&(this->reverseArrhenius_).n + 5) = 0;
  *(undefined8 *)((long)&(this->reverseArrhenius_).E + 5) = 0;
  (this->thirdBodies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->thirdBodies_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->thirdBodies_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->thirdBodies_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->thirdBodies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->thirdBodies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->thirdBodies_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fallOffBody_)._M_dataplus._M_p = (pointer)&(this->fallOffBody_).field_2;
  (this->fallOffBody_)._M_string_length = 0;
  (this->fallOffBody_).field_2._M_local_buf[0] = '\0';
  (this->SRI_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->SRI_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->TROE_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->TROE_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->LOW_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->TROE_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->LOW_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->LOW_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->SRI_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IO::Reaction::Reaction()
:flagReversible_(true)
,flagDuplicate_(false)
,reactants_()
,products_()
,forwardArrhenius_()
,reverseArrhenius_()
,flagHasREV_(false)
,flagThirdBody_(false)
,flagLOW_(false)
,flagTROE_(false)
,flagSRI_(false)
,flagPressureDependent_(false)
,thirdBodies_()
,fallOffBody_()
{}